

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_bbdpre.c
# Opt level: O1

int IDABBDPrecReInit(void *ida_mem,sunindextype mudq,sunindextype mldq,sunrealtype dq_rel_yy)

{
  double __x;
  long *plVar1;
  long lVar2;
  int line;
  int iVar3;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar3 = -1;
    ida_mem = (IDAMem)0x0;
    error_code = -1;
    line = 0x139;
  }
  else if (*(long *)((long)ida_mem + 0x418) == 0) {
    msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
    iVar3 = -2;
    error_code = -2;
    line = 0x142;
  }
  else {
    plVar1 = *(long **)(*(long *)((long)ida_mem + 0x418) + 0x118);
    if (plVar1 != (long *)0x0) {
      lVar2 = plVar1[7];
      if (mudq < 1) {
        mudq = 0;
      }
      if (lVar2 <= mudq) {
        mudq = lVar2 + -1;
      }
      if (mldq < 1) {
        mldq = 0;
      }
      *plVar1 = mudq;
      if (lVar2 <= mldq) {
        mldq = lVar2 + -1;
      }
      plVar1[1] = mldq;
      if (dq_rel_yy <= 0.0) {
        __x = *(double *)((long)ida_mem + 8);
        dq_rel_yy = 0.0;
        if (0.0 < __x) {
          if (__x < 0.0) {
            dq_rel_yy = sqrt(__x);
          }
          else {
            dq_rel_yy = SQRT(__x);
          }
        }
      }
      plVar1[4] = (long)dq_rel_yy;
      plVar1[0x12] = 0;
      return 0;
    }
    msgfmt = "BBD peconditioner memory is NULL. IDABBDPrecInit must be called.";
    iVar3 = -5;
    error_code = -5;
    line = 0x14b;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDABBDPrecReInit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_bbdpre.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int IDABBDPrecReInit(void* ida_mem, sunindextype mudq, sunindextype mldq,
                     sunrealtype dq_rel_yy)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  IBBDPrecData pdata;
  sunindextype Nlocal;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_NULL);
    return (IDALS_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Test if the LS linear solver interface has been created */
  if (IDA_mem->ida_lmem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* Test if the preconditioner data is non-NULL */
  if (idals_mem->pdata == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_PMEM_NULL);
    return (IDALS_PMEM_NULL);
  }
  pdata = (IBBDPrecData)idals_mem->pdata;

  /* Load half-bandwidths. */
  Nlocal      = pdata->n_local;
  pdata->mudq = SUNMIN(Nlocal - 1, SUNMAX(0, mudq));
  pdata->mldq = SUNMIN(Nlocal - 1, SUNMAX(0, mldq));

  /* Set rel_yy based on input value dq_rel_yy (0 implies default). */
  pdata->rel_yy = (dq_rel_yy > ZERO) ? dq_rel_yy : SUNRsqrt(IDA_mem->ida_uround);

  /* Re-initialize nge */
  pdata->nge = 0;

  return (IDALS_SUCCESS);
}